

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

bool Diligent::LinuxFileSystem::DeleteDirectory(Char *strPath)

{
  int iVar1;
  char *__dir;
  _func_int_char_ptr_stat_ptr_int_FTW_ptr *__func;
  __0 local_45;
  int res;
  anon_class_1_0_00000001 Callaback;
  allocator local_31;
  undefined1 local_30 [8];
  string path;
  Char *strPath_local;
  
  path.field_2._8_8_ = strPath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,strPath,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  BasicFileSystem::CorrectSlashes((String *)local_30,'\0');
  __dir = (char *)std::__cxx11::string::c_str();
  __func = DeleteDirectory(char_const*)::$_0::operator_cast_to_function_pointer(&local_45);
  iVar1 = nftw(__dir,(__nftw_func_t)__func,0x20,0xb);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::DeleteDirectory(const Char* strPath)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback =
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            return remove(Path);
        };

    const auto res = nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
    return res == 0;
}